

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O3

void __thiscall EOClient::Tick(EOClient *this)

{
  string *data_00;
  uint *puVar1;
  PacketState PVar2;
  FILE *__stream;
  _List_node_base *p_Var3;
  size_type sVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  uint uVar8;
  size_t sVar9;
  mapped_type *this_00;
  size_t __len;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  string empty;
  string data;
  key_type local_70;
  uchar *local_50;
  size_t local_48;
  uchar local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = '\0';
  __stream = (FILE *)this->upload_fh;
  if (__stream == (FILE *)0x0) {
    sVar11 = 1;
    if (this->packet_state == ReadData) {
      sVar11 = (size_t)this->length;
    }
    Client::Recv_abi_cxx11_(&local_70,&this->super_Client,sVar11);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if (local_48 != 0) {
      data_00 = &this->data;
      do {
        PVar2 = this->packet_state;
        if (PVar2 == ReadLen1) {
          this->raw_length[0] = *local_50;
          *local_50 = '\0';
          std::__cxx11::string::erase((ulong)&local_50,0);
          this->packet_state = ReadLen2;
          if (local_48 != 0) goto LAB_00132593;
        }
        else {
          if (PVar2 == ReadLen2) {
LAB_00132593:
            this->raw_length[1] = *local_50;
            *local_50 = '\0';
            std::__cxx11::string::erase((ulong)&local_50,0);
            uVar8 = PacketProcessor::Number(this->raw_length[0],this->raw_length[1],0xfe,0xfe);
            this->length = uVar8;
            this->packet_state = ReadData;
            if (local_48 == 0) goto LAB_001326c1;
          }
          else if (PVar2 != ReadData) {
            memset(local_50,0,local_48);
            sVar9 = (this->data)._M_string_length;
            if (sVar9 != 0) {
              memset((data_00->_M_dataplus)._M_p,0,sVar9);
            }
            local_48 = 0;
            *local_50 = '\0';
            (this->data)._M_string_length = 0;
            *(this->data)._M_dataplus._M_p = '\0';
            this->packet_state = ReadLen1;
            goto LAB_001326c1;
          }
          sVar4 = (this->data)._M_string_length;
          std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_50);
          std::__cxx11::string::_M_append((char *)data_00,(ulong)local_70._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,
                            CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                     local_70.field_2._M_local_buf[0]) + 1);
          }
          sVar9 = local_48;
          if (this->length <= local_48) {
            sVar9 = (ulong)this->length;
          }
          if (sVar9 != 0) {
            memset(local_50,0,sVar9);
          }
          std::__cxx11::string::erase((ulong)&local_50,0);
          puVar1 = &this->length;
          *puVar1 = *puVar1 + ((int)sVar4 - (int)(this->data)._M_string_length);
          if (*puVar1 == 0) {
            Execute(this,data_00);
            sVar9 = (this->data)._M_string_length;
            if (sVar9 != 0) {
              memset((data_00->_M_dataplus)._M_p,0,sVar9);
            }
            (this->data)._M_string_length = 0;
            *(this->data)._M_dataplus._M_p = '\0';
            this->packet_state = ReadLen1;
            break;
          }
        }
LAB_001326c1:
      } while (local_48 != 0);
    }
  }
  else {
    uVar12 = this->upload_size - this->upload_pos;
    sVar11 = (this->super_Client).send_buffer_used;
    uVar10 = (this->super_Client).send_buffer._M_string_length - sVar11;
    if (uVar12 <= uVar10) {
      uVar10 = uVar12;
    }
    if (uVar10 == 0) {
      if (this->upload_size == this->upload_pos && sVar11 == 0) {
        fclose(__stream);
        this->upload_fh = (FILE *)0x0;
        this->upload_pos = 0;
        this->upload_size = 0;
        std::__cxx11::string::swap((string *)&(this->super_Client).send_buffer);
        sVar11 = this->send_buffer2_ppos;
        sVar5 = (this->super_Client).send_buffer_gpos;
        sVar6 = (this->super_Client).send_buffer_ppos;
        (this->super_Client).send_buffer_gpos = this->send_buffer2_gpos;
        (this->super_Client).send_buffer_ppos = sVar11;
        this->send_buffer2_gpos = sVar5;
        this->send_buffer2_ppos = sVar6;
        sVar11 = (this->super_Client).send_buffer_used;
        (this->super_Client).send_buffer_used = this->send_buffer2_used;
        this->send_buffer2_used = sVar11;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::swap((string *)&this->send_buffer2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    else {
      sVar9 = fread((this->super_Client).send_buffer._M_dataplus._M_p +
                    (this->super_Client).send_buffer_ppos,1,uVar10,__stream);
      if (this->upload_type == FILE_MAP) {
        p_Var3 = (this->super_Client).server[1].clients.
                 super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                 super__List_node_base._M_prev;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"GlobalPK","");
        this_00 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&p_Var3[0x19]._M_prev,&local_70);
        bVar7 = util::variant::GetBool(this_00);
        if (bVar7) {
          bVar7 = World::PKExcept((World *)(this->super_Client).server[1].clients.
                                           super__List_base<Client_*,_std::allocator<Client_*>_>.
                                           _M_impl._M_node.super__List_node_base._M_prev,
                                  (int)this->player->character->mapid);
          bVar7 = !bVar7;
        }
        else {
          bVar7 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
        if (bVar7) {
          uVar12 = this->upload_pos;
          uVar10 = uVar12 + sVar9;
          if ((uVar12 < 4) && (3 < uVar10)) {
            (this->super_Client).send_buffer._M_dataplus._M_p
            [((this->super_Client).send_buffer_ppos - uVar12) + 3] = -1;
            uVar12 = this->upload_pos;
            uVar10 = uVar12 + sVar9;
          }
          if ((uVar12 < 4) && (4 < uVar10)) {
            (this->super_Client).send_buffer._M_dataplus._M_p
            [((this->super_Client).send_buffer_ppos - uVar12) + 4] = '\x01';
            uVar12 = this->upload_pos;
            uVar10 = uVar12 + sVar9;
          }
          if ((uVar12 < 0x20) && (0x1f < uVar10)) {
            (this->super_Client).send_buffer._M_dataplus._M_p
            [((this->super_Client).send_buffer_ppos - uVar12) + 0x1f] = '\x04';
          }
        }
      }
      this->upload_pos = this->upload_pos + sVar9;
      auVar13._8_4_ = (int)sVar9;
      auVar13._0_8_ = sVar9;
      auVar13._12_4_ = (int)(sVar9 >> 0x20);
      (this->super_Client).send_buffer_ppos = sVar9 + (this->super_Client).send_buffer_ppos;
      (this->super_Client).send_buffer_used = auVar13._8_8_ + (this->super_Client).send_buffer_used;
    }
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void EOClient::Tick()
{
	std::string data;
	int done = false;
	int oldlength;

	if (this->upload_fh)
	{
		// Send more of the file instead of doing other tasks
		std::size_t upload_available = std::min(this->upload_size - this->upload_pos, Client::SendBufferRemaining());

		if (upload_available != 0)
		{
			upload_available = std::fread(&this->send_buffer[this->send_buffer_ppos], 1, upload_available, this->upload_fh);

			// Dynamically rewrite the bytes of the map to enable PK
			if (this->upload_type == FILE_MAP && this->server()->world->config["GlobalPK"] && !this->server()->world->PKExcept(player->character->mapid))
			{
				if (this->upload_pos <= 0x03 && this->upload_pos + upload_available > 0x03)
					this->send_buffer[this->send_buffer_ppos + 0x03 - this->upload_pos] = 0xFF;

				if (this->upload_pos <= 0x03 && this->upload_pos + upload_available > 0x04)
					this->send_buffer[this->send_buffer_ppos + 0x04 - this->upload_pos] = 0x01;

				if (this->upload_pos <= 0x1F && this->upload_pos + upload_available > 0x1F)
					this->send_buffer[this->send_buffer_ppos + 0x1F - this->upload_pos] = 0x04;
			}

			this->upload_pos += upload_available;
			this->send_buffer_ppos += upload_available;
			this->send_buffer_used += upload_available;
		}
		else if (this->upload_pos == this->upload_size && this->SendBufferRemaining() == this->send_buffer.length())
		{
			using std::swap;

			std::fclose(this->upload_fh);
			this->upload_fh = 0;
			this->upload_pos = 0;
			this->upload_size = 0;

			// Place our temporary buffer back as the real one
			swap(this->send_buffer, this->send_buffer2);
			swap(this->send_buffer_gpos, this->send_buffer2_gpos);
			swap(this->send_buffer_ppos, this->send_buffer2_ppos);
			swap(this->send_buffer_used, this->send_buffer2_used);

			// We're not using this anymore...
			std::string empty;
			swap(this->send_buffer2, empty);
		}
	}
	else
	{
		data = this->Recv((this->packet_state == EOClient::ReadData) ? this->length : 1);

		while (data.length() > 0 && !done)
		{
			switch (this->packet_state)
			{
				case EOClient::ReadLen1:
					this->raw_length[0] = data[0];
					data[0] = '\0';
					data.erase(0, 1);
					this->packet_state = EOClient::ReadLen2;

					if (data.length() == 0)
					{
						break;
					}

				case EOClient::ReadLen2:
					this->raw_length[1] = data[0];
					data[0] = '\0';
					data.erase(0, 1);
					this->length = PacketProcessor::Number(this->raw_length[0], this->raw_length[1]);
					this->packet_state = EOClient::ReadData;

					if (data.length() == 0)
					{
						break;
					}

				case EOClient::ReadData:
					oldlength = this->data.length();
					this->data += data.substr(0, this->length);
					std::fill(data.begin(), data.begin() + std::min<std::size_t>(data.length(), this->length), '\0');
					data.erase(0, this->length);
					this->length -= this->data.length() - oldlength;

					if (this->length == 0)
					{
						this->Execute(this->data);

						std::fill(UTIL_RANGE(this->data), '\0');
						this->data.erase();
						this->packet_state = EOClient::ReadLen1;

						done = true;
					}
					break;

				default:
					// If the code ever gets here, something is broken, so we just reset the client's state.
					std::fill(UTIL_RANGE(data), '\0');
					std::fill(UTIL_RANGE(this->data), '\0');
					data.erase();
					this->data.erase();
					this->packet_state = EOClient::ReadLen1;
			}
		}
	}
}